

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O1

int __thiscall CPortDataTransfer::DispatchCommand(CPortDataTransfer *this,int client_fd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  FILE *pFVar6;
  long lVar7;
  time_t tVar8;
  undefined8 uVar9;
  int iVar10;
  ulong __n;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string ret;
  char buffer [4096];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1088;
  CPortDataTransfer *local_1068;
  char *local_1060;
  size_t local_1058;
  char local_1050 [16];
  double local_1040;
  string local_1038 [128];
  
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_1038[0].field_2;
  local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"#","");
  SplitString(&this->m_Msg,&local_1088,local_1038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)local_1088.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    if (local_1088.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
      send(client_fd,"\r\n",2,0);
    }
    else {
      send(client_fd,
           local_1088.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
           local_1088.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,0);
    }
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"226 Directory send OK.\r\n","");
    ControlSockSendMsg(this,local_1038);
    uVar9 = std::__cxx11::string::~string((string *)local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1060 != paVar1) {
      operator_delete(local_1060);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1088);
    _Unwind_Resume(uVar9);
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)local_1088.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    local_1068 = this;
    chdir(local_1088.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    pFVar6 = fopen(local_1088.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,"rb");
    fseek(pFVar6,0,2);
    lVar11 = ftell(pFVar6);
    fseek(pFVar6,0,0);
    bzero(local_1038,0x1000);
    lVar7 = time((time_t *)0x0);
    sVar4 = fread(local_1038,1,0x1000,pFVar6);
    if (0 < (int)sVar4) {
      local_1040 = (double)lVar11;
      lVar11 = 0;
      lVar12 = 0;
      do {
        __n = (ulong)((uint)sVar4 & 0x7fffffff);
        sVar5 = send(client_fd,local_1038,__n,0);
        if (sVar5 < 1) break;
        lVar11 = lVar11 + __n;
        lVar12 = lVar12 + __n;
        tVar8 = time((time_t *)0x0);
        if (lVar7 < tVar8) {
          auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar13._0_8_ = lVar11;
          auVar13._12_4_ = 0x45300000;
          auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = 0x45300000;
          printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",
                 (((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / local_1040) *
                 100.0,((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                       0.0009765625,
                 local_1088.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
          lVar11 = 0;
          lVar7 = tVar8;
        }
        bzero(local_1038,0x1000);
        sVar4 = fread(local_1038,1,0x1000,pFVar6);
      } while (0 < (int)sVar4);
    }
    fclose(pFVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Send file completed.",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_1060 = local_1050;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1060,"226 Transfer complete.\r\n","");
    write(local_1068->m_ControlSock,local_1060,local_1058);
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((char *)local_1088.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    iVar10 = 0;
    if (iVar3 != 0) goto LAB_001201a3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Get file ",9);
    pcVar2 = local_1088.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12f2b8);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
    pcVar2 = local_1088.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12f2b8);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_1068 = this;
    chdir(local_1088.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    pFVar6 = fopen(local_1088.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,"wb");
    bzero(local_1038,0x1000);
    lVar11 = 0;
    lVar7 = time((time_t *)0x0);
    while( true ) {
      sVar4 = recv(client_fd,local_1038,0x1000,0);
      if ((long)sVar4 < 1) break;
      fwrite(local_1038,1,sVar4,pFVar6);
      lVar11 = lVar11 + sVar4;
      tVar8 = time((time_t *)0x0);
      if (lVar7 < tVar8) {
        auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar14._0_8_ = lVar11;
        auVar14._12_4_ = 0x45300000;
        printf("speed is: %.1f KB/s\n",
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 0.0009765625);
        lVar11 = 0;
        lVar7 = tVar8;
      }
      bzero(local_1038,0x1000);
    }
    fclose(pFVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Recv file completed.",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_1060 = local_1050;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1060,"226 Transfer complete.\r\n","");
    write(local_1068->m_ControlSock,local_1060,local_1058);
  }
  if (local_1060 != local_1050) {
    operator_delete(local_1060);
  }
  iVar10 = 1;
LAB_001201a3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1088);
  return iVar10;
}

Assistant:

int CPortDataTransfer::DispatchCommand(int client_fd) {
    vector<string> v;
    SplitString(m_Msg,v,"#");
    if(v[0] == "SENDLIST"){
        if(!v[1].empty()){
            send(client_fd,v[1].c_str(),v[1].size(),0);
        }
        else{
            send(client_fd,"\r\n",2,0);
        }
        string ret = "226 Directory send OK.\r\n";
        ControlSockSendMsg(ret);
    }
    else if(v[0] == "SENDFILE"){
        //cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;

        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"rb");
        fseek(file,0,2);
        long size = ftell(file);
        fseek(file,0,0);
        int n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time= time(NULL);
        unsigned long sum_sec = 0;
        unsigned long sum = 0;
        while((n = fread(buffer,1,BUFFER_SIZE,file)) > 0){
            if(send(client_fd,buffer,n,0) <= 0)
                break;
            sum_sec += n;
            sum += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec * 1.0) / 1024;
                double progress = sum * 1.0 / size * 100;
                printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",v[2].c_str(),progress,speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Send file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else if(v[0] == "RECVFILE"){
        cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;
        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"wb");
        ssize_t n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time = time(NULL);
        unsigned long sum_sec = 0;
        unsigned sum = 0;
        while((n = recv(client_fd,buffer,BUFFER_SIZE,0)) > 0){
            fwrite(buffer,1,n,file);
            sum_sec += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec  * 1.0) / 1024;
                printf("speed is: %.1f KB/s\n",speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Recv file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else{
        return 0;
    }
}